

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

void __thiscall tcu::Matrix<float,_3,_2>::Matrix(Matrix<float,_3,_2> *this,float *src)

{
  float *pfVar1;
  undefined4 local_2c;
  undefined4 local_20;
  undefined4 local_1c;
  int col;
  int row;
  float *src_local;
  Matrix<float,_3,_2> *this_local;
  
  Vector<tcu::Vector<float,_3>,_2>::Vector(&this->m_data);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      if (local_1c == local_20) {
        local_2c = *src;
      }
      else {
        local_2c = 0.0;
      }
      pfVar1 = operator()(this,local_1c,local_20);
      *pfVar1 = local_2c;
    }
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const T& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? src : T(0);
}